

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cc
# Opt level: O0

bool ssl::initialize(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  char *__s;
  reference __lhs;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  bool local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  path local_200;
  reference local_1d8;
  string *filename;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *dir;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168 [32];
  iterator local_148;
  size_type local_140;
  undefined1 local_133;
  undefined1 local_132;
  allocator<char> local_131;
  string local_130;
  char *local_110;
  char *manualPath;
  allocator<char> local_100;
  allocator<char> local_ff;
  allocator<char> local_fe;
  allocator<char> local_fd [20];
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_9;
  
  if ((initialize()::dirs_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&initialize()::dirs_abi_cxx11_), iVar2 != 0)) {
    manualPath._6_1_ = 1;
    local_e8 = &local_e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"/usr/lib/",&local_e9);
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,".//usr/local/lib/",local_fd);
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"/usr/local/openssl/lib/",&local_fe)
    ;
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"/usr/local/ssl/lib/",&local_ff);
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_60,"/opt/openssl/lib/",&local_100);
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"/lib/",(allocator<char> *)((long)&manualPath + 7));
    manualPath._6_1_ = 0;
    local_20 = &local_e0;
    local_18 = 6;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&manualPath + 5));
    __l_00._M_len = local_18;
    __l_00._M_array = local_20;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&initialize()::dirs_abi_cxx11_,__l_00,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&manualPath + 5));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&manualPath + 5));
    local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
    do {
      local_2b0 = local_2b0 + -1;
      std::__cxx11::string::~string((string *)local_2b0);
    } while (local_2b0 != &local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&manualPath + 7));
    std::allocator<char>::~allocator(&local_100);
    std::allocator<char>::~allocator(&local_ff);
    std::allocator<char>::~allocator(&local_fe);
    std::allocator<char>::~allocator(local_fd);
    std::allocator<char>::~allocator(&local_e9);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&initialize()::dirs_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&initialize()::dirs_abi_cxx11_);
  }
  __s = getenv("SPONSORYEET_SSL_LIB");
  local_132 = 0;
  local_133 = 0;
  local_2c1 = false;
  local_110 = __s;
  if (__s != (char *)0x0) {
    std::allocator<char>::allocator();
    local_132 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,__s,&local_131);
    local_133 = 1;
    local_2c1 = attemptOpen(&local_130);
  }
  if ((local_133 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_130);
  }
  if ((local_132 & 1) != 0) {
    std::allocator<char>::~allocator(&local_131);
  }
  if (local_2c1 == false) {
    if ((initialize()::libs_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&initialize()::libs_abi_cxx11_), iVar2 != 0)) {
      __range1._5_1_ = 1;
      local_190 = &local_188;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"libssl.so",(allocator<char> *)((long)&__range1 + 7));
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_168,"libgnutls-openssl.so",(allocator<char> *)((long)&__range1 + 6));
      __range1._5_1_ = 0;
      local_148 = &local_188;
      local_140 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range1 + 4));
      __l._M_len = local_140;
      __l._M_array = local_148;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&initialize()::libs_abi_cxx11_,__l,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&__range1 + 4));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range1 + 4));
      local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
      do {
        local_338 = local_338 + -1;
        std::__cxx11::string::~string((string *)local_338);
      } while (local_338 != &local_188);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,&initialize()::libs_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&initialize()::libs_abi_cxx11_);
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&initialize()::dirs_abi_cxx11_);
    dir = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&initialize()::dirs_abi_cxx11_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&dir), __stream = _stderr, bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&initialize()::libs_abi_cxx11_);
      filename = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&initialize()::libs_abi_cxx11_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&filename), bVar1) {
        local_1d8 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        std::operator+(&local_220,__lhs,local_1d8);
        std::filesystem::__cxx11::path::path(&local_200,&local_220,auto_format);
        bVar1 = std::filesystem::exists(&local_200);
        std::filesystem::__cxx11::path::~path(&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::operator+(&local_240,__lhs,local_1d8);
          bVar1 = attemptOpen(&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          if (bVar1) {
            return true;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    uVar3 = dlerror();
    fprintf(__stream,"Failed to find any valid openssl (last error: %s\n)\n",uVar3);
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return (bool)local_9;
}

Assistant:

bool initialize()
{
    static const std::vector<std::string> dirs = {
        "/usr/lib/",
        "./"
        "/usr/local/lib/",
        "/usr/local/openssl/lib/",
        "/usr/local/ssl/lib/",
        "/opt/openssl/lib/",
        "/lib/",
    };
    const char *manualPath = getenv("SPONSORYEET_SSL_LIB");
    if (manualPath && attemptOpen(manualPath)) {
        return true;
    }

    // TODO: more?
    static const std::vector<std::string> libs = {
        "libssl.so",
        "libgnutls-openssl.so"
    };
    for (const std::string &dir : dirs) {
        for (const std::string &filename : libs) {
            if (!std::filesystem::exists(dir + filename)) {
                continue;
            }
            if (attemptOpen(dir + filename)) {
                return true;
            }
        }
    }

    fprintf(stderr, "Failed to find any valid openssl (last error: %s\n)\n", dlerror());
    return false;
}